

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool google::protobuf::anon_unknown_31::IsSubSymbol(StringPiece sub_symbol,StringPiece super_symbol)

{
  StringPiece prefix;
  StringPiece str;
  bool bVar1;
  char cVar2;
  size_type i;
  bool local_6a;
  bool local_69;
  undefined1 local_28 [8];
  StringPiece super_symbol_local;
  StringPiece sub_symbol_local;
  
  super_symbol_local.length_ = (size_type)sub_symbol.ptr_;
  super_symbol_local.ptr_ = (char *)super_symbol.length_;
  local_28 = (undefined1  [8])super_symbol.ptr_;
  bVar1 = stringpiece_internal::operator==(sub_symbol,super_symbol);
  local_69 = true;
  if (!bVar1) {
    str.length_ = (size_type)super_symbol_local.ptr_;
    str.ptr_ = (char *)local_28;
    prefix.length_ = sub_symbol.length_;
    prefix.ptr_ = (char *)super_symbol_local.length_;
    bVar1 = HasPrefixString(str,prefix);
    local_6a = false;
    if (bVar1) {
      i = stringpiece_internal::StringPiece::size((StringPiece *)&super_symbol_local.length_);
      cVar2 = stringpiece_internal::StringPiece::operator[]((StringPiece *)local_28,i);
      local_6a = cVar2 == '.';
    }
    local_69 = local_6a;
  }
  return local_69;
}

Assistant:

bool IsSubSymbol(StringPiece sub_symbol, StringPiece super_symbol) {
  return sub_symbol == super_symbol ||
         (HasPrefixString(super_symbol, sub_symbol) &&
          super_symbol[sub_symbol.size()] == '.');
}